

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

Statement *
slang::ast::ForeverLoopStatement::fromSyntax
          (Compilation *compilation,ForeverStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ForeverLoopStatement *stmt;
  SourceRange local_38;
  
  uVar1 = (stmtCtx->flags).m_bits;
  (stmtCtx->flags).m_bits = uVar1 | 1;
  iVar2 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ForeverLoopStatement,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Statement *)CONCAT44(extraout_var,iVar2),
                    &local_38);
  if (((Statement *)CONCAT44(extraout_var,iVar2))->kind == Invalid) {
    stmt = (ForeverLoopStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  (stmtCtx->flags).m_bits = uVar1 & 9 | (stmtCtx->flags).m_bits & 0x16;
  return &stmt->super_Statement;
}

Assistant:

Statement& ForeverLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeverStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeverLoopStatement>(bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);

    return *result;
}